

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O1

void __thiscall Printer::PrintHeader(Printer *this,ostream *c)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int local_38;
  
  if (this->attrCount < 1) {
    iVar3 = 0;
  }
  else {
    lVar5 = 0;
    iVar3 = 0;
    do {
      __s = this->psHeader[lVar5];
      if (__s == (char *)0x0) {
        std::ios::clear((int)c + (int)*(undefined8 *)(*(long *)c + -0x18));
      }
      else {
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(c,__s,sVar2);
      }
      sVar2 = strlen(this->psHeader[lVar5]);
      iVar1 = this->spaces[lVar5];
      if (0 < iVar1) {
        iVar4 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(c," ",1);
          iVar4 = iVar4 + 1;
          iVar1 = this->spaces[lVar5];
        } while (iVar4 < iVar1);
      }
      local_38 = (int)sVar2;
      iVar3 = iVar3 + local_38 + iVar1;
      lVar5 = lVar5 + 1;
    } while (lVar5 < this->attrCount);
  }
  std::__ostream_insert<char,std::char_traits<char>>(c,"\n",1);
  if (0 < iVar3) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(c,"-",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(c,"\n",1);
  return;
}

Assistant:

void Printer::PrintHeader( ostream &c ) const
{
    int dashes = 0;
    int iLen;
    int i,j;

    for (i = 0; i < attrCount; i++) {
        // Print out the header information name
        c << psHeader[i];
        iLen = strlen(psHeader[i]);
        dashes += iLen;

        for (j = 0; j < spaces[i]; j++)
            c << " ";

        dashes += spaces[i];
    }

    c << "\n";
    for (i = 0; i < dashes; i++) c << "-";
    c << "\n";
}